

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void get_header(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
               cio_read_buffer *buffer,size_t num_bytes)

{
  byte first_header_byte;
  _Bool _Var1;
  cio_error err_00;
  byte *pbVar2;
  char *reason;
  char *err_msg;
  uint8_t rsv_field;
  uint8_t field;
  uint8_t *ptr;
  cio_websocket *websocket;
  size_t num_bytes_local;
  cio_read_buffer *buffer_local;
  cio_error err_local;
  void *handler_context_local;
  cio_buffered_stream *buffered_stream_local;
  
  _Var1 = handled_read_error((cio_websocket *)handler_context,err);
  if (!_Var1) {
    pbVar2 = cio_read_buffer_get_read_ptr(buffer);
    first_header_byte = *pbVar2;
    cio_read_buffer_consume(buffer,num_bytes);
    *(ushort *)((long)handler_context + 0x10) =
         *(ushort *)((long)handler_context + 0x10) & 0xfffe |
         (ushort)((first_header_byte & 0x80) == 0x80);
    if ((first_header_byte & 0x70) == 0) {
      reason = handle_fin((cio_websocket *)handler_context,first_header_byte);
      if (reason == (char *)0x0) {
        err_00 = cio_buffered_stream_read_at_least
                           (buffered_stream,buffer,1,get_first_length,handler_context);
        if (err_00 != CIO_SUCCESS) {
          handle_error((cio_websocket *)handler_context,err_00,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
                       "error while start reading websocket frame length");
        }
      }
      else {
        handle_error((cio_websocket *)handler_context,CIO_PROTOCOL_NOT_SUPPORTED,
                     CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR,reason);
      }
    }
    else {
      handle_error((cio_websocket *)handler_context,CIO_PROTOCOL_NOT_SUPPORTED,
                   CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR,"reserved bit set in frame");
    }
  }
  return;
}

Assistant:

static void get_header(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	(void)num_bytes;
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (cio_unlikely(handled_read_error(websocket, err))) {
		return;
	}

	uint8_t *ptr = cio_read_buffer_get_read_ptr(buffer);
	uint8_t field = *ptr;
	cio_read_buffer_consume(buffer, num_bytes);

	websocket->ws_private.ws_flags.fin = (field & WS_HEADER_FIN) == WS_HEADER_FIN;

	uint8_t rsv_field = field & RSV_MASK;
	if (cio_unlikely(rsv_field != 0)) {
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "reserved bit set in frame");
		return;
	}

	const char *err_msg = handle_fin(websocket, field);
	if (cio_unlikely(err_msg != NULL)) {
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, err_msg);
		return;
	}

	err = cio_buffered_stream_read_at_least(buffered_stream, buffer, 1, get_first_length, websocket);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "error while start reading websocket frame length");
	}
}